

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuperH.cpp
# Opt level: O2

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
CShArchitecture::parseOpcode(CShArchitecture *this,Parser *parser)

{
  ShParser shParser;
  _func_int **local_b8;
  undefined1 local_b0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98 [2];
  _Alloc_hider local_78;
  undefined1 local_70 [8];
  _Rb_tree_node_base local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  bool local_38;
  
  local_b0._8_8_ = local_98;
  local_98[0]._0_8_ = 0;
  local_98[0]._8_8_ = 0;
  local_b0._16_8_ = 0;
  local_78._M_p = local_70 + 8;
  local_68._0_8_ = 0;
  local_68._M_parent = (_Base_ptr)0x0;
  local_70 = (undefined1  [8])0x0;
  local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38 = true;
  ShParser::parseOpcode((ShParser *)&local_b8,(Parser *)local_b0);
  (this->super_Architecture)._vptr_Architecture = local_b8;
  ShParser::~ShParser((ShParser *)local_b0);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> CShArchitecture::parseOpcode(Parser& parser)
{
	ShParser shParser;
	return shParser.parseOpcode(parser);
}